

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O3

void __thiscall helics::CoreBroker::transmitDelayedMessages(CoreBroker *this)

{
  optional<helics::ActionMessage> msg;
  _Optional_payload_base<helics::ActionMessage> local_1a0;
  _Optional_payload_base<helics::ActionMessage> local_e0;
  
  gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::pop
            ((optional<helics::ActionMessage> *)&local_1a0,&this->delayTransmitQueue);
  if (local_1a0._M_engaged == true) {
    do {
      local_1a0._M_payload._M_value.source_id.gid =
           (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid;
      (*(this->super_Broker)._vptr_Broker[0x22])(this,0,&local_1a0);
      gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::pop
                ((optional<helics::ActionMessage> *)&local_e0,&this->delayTransmitQueue);
      std::_Optional_payload_base<helics::ActionMessage>::_M_move_assign(&local_1a0,&local_e0);
      if (local_e0._M_engaged == true) {
        local_e0._M_engaged = false;
        ActionMessage::~ActionMessage((ActionMessage *)&local_e0);
      }
    } while (local_1a0._M_engaged != false);
  }
  return;
}

Assistant:

void CoreBroker::transmitDelayedMessages()
{
    auto msg = delayTransmitQueue.pop();
    while (msg) {
        msg->source_id = global_broker_id_local;
        transmit(parent_route_id, *msg);
        msg = delayTransmitQueue.pop();
    }
}